

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O0

void __thiscall elem::destroy(elem *this)

{
  cilk_c_reducer_deallocate_fn_t p_Var1;
  bool bVar2;
  elem *in_RDI;
  cilk_c_reducer_deallocate_fn_t deallocate_fn;
  cilk_c_reducer_destroy_fn_t destroy_fn;
  cilk_c_monoid *monoid;
  
  bVar2 = is_leftmost(in_RDI);
  if (!bVar2) {
    p_Var1 = (in_RDI->hb->__c_monoid).deallocate_fn;
    (*(in_RDI->hb->__c_monoid).destroy_fn)(in_RDI->hb,in_RDI->view);
    (*p_Var1)(in_RDI->hb,in_RDI->view);
  }
  in_RDI->view = (void *)0x0;
  return;
}

Assistant:

void elem::destroy()
{
    if (! is_leftmost()) {

        // Call destroy_fn and deallocate_fn on the view, but not if it's the
        // leftmost view.
        cilk_c_monoid *monoid = &(hb->__c_monoid);
        cilk_c_reducer_destroy_fn_t    destroy_fn    = monoid->destroy_fn;
        cilk_c_reducer_deallocate_fn_t deallocate_fn = monoid->deallocate_fn;
	
        destroy_fn((void*)hb, view);
        deallocate_fn((void*)hb, view);
    }

    view = 0;
}